

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O0

Rect __thiscall nite::Rect::operator*(Rect *this,float c)

{
  Rect *in_RSI;
  undefined8 in_XMM1_Qa;
  Rect RVar1;
  float c_local;
  Rect *this_local;
  Rect *R;
  
  Rect(this,in_RSI);
  this->x = c * this->x;
  this->y = c * this->y;
  this->w = c * this->w;
  RVar1.x = c * this->h;
  RVar1.y = 0.0;
  this->h = RVar1.x;
  RVar1.w = (float)(int)in_XMM1_Qa;
  RVar1.h = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  return RVar1;
}

Assistant:

nite::Rect nite::Rect::operator*(float c){
	Rect R = *this;
	R.x *= c;
	R.y *= c;
	R.w *= c;
	R.h *= c;
	return R;
}